

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall cfd::core::Address::CalculateTaproot(Address *this,string *bech32_hrp)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  SchnorrPubkey::GetData((ByteData *)&_Stack_38,&this->schnorr_pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->hash_,&_Stack_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  CalculateBech32m(this,&this->hash_,bech32_hrp);
  return;
}

Assistant:

void Address::CalculateTaproot(const std::string& bech32_hrp) {
  hash_ = schnorr_pubkey_.GetData();
  CalculateBech32m(hash_, bech32_hrp);
}